

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int simpleCreate(int argc,char **argv,sqlite3_tokenizer **ppTokenizer)

{
  undefined1 auVar1 [16];
  int iVar2;
  sqlite3_tokenizer *__s;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar24;
  int iVar25;
  uint uVar26;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar42;
  uint uVar52;
  uint uVar53;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint uVar54;
  uint uVar55;
  uint uVar60;
  uint uVar61;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar62;
  uint uVar63;
  uint uVar65;
  uint uVar66;
  undefined1 auVar64 [16];
  uint uVar67;
  uint uVar68;
  uint uVar71;
  uint uVar72;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  undefined1 auVar78 [16];
  
  iVar2 = sqlite3_initialize();
  iVar25 = 7;
  if ((iVar2 == 0) &&
     (__s = (sqlite3_tokenizer *)sqlite3Malloc(0x88), __s != (sqlite3_tokenizer *)0x0)) {
    memset(__s,0,0x88);
    auVar1 = _DAT_001d5060;
    if (argc < 2) {
      uVar14._0_1_ = '\r';
      uVar14._1_1_ = '\0';
      uVar14._2_1_ = '\0';
      uVar14._3_1_ = '\0';
      uVar24 = 0xe;
      uVar26 = 0xf;
      uVar27 = 0x10;
      uVar74 = 9;
      uVar75 = 10;
      uVar76 = 0xb;
      uVar77 = 0xc;
      uVar6 = 5;
      uVar7 = 6;
      uVar8 = 7;
      uVar9 = 8;
      uVar10 = 1;
      uVar11 = 2;
      uVar12 = 3;
      uVar13 = 4;
      lVar4 = 0;
      uVar55 = uVar10;
      uVar60 = uVar11;
      uVar61 = uVar12;
      uVar62 = uVar13;
      uVar63 = uVar74;
      uVar65 = uVar75;
      uVar66 = uVar76;
      uVar67 = uVar77;
      uVar42 = uVar14;
      uVar52 = uVar24;
      uVar53 = uVar26;
      uVar54 = uVar27;
      uVar68 = uVar6;
      uVar71 = uVar7;
      uVar72 = uVar8;
      uVar73 = uVar9;
      do {
        auVar28._8_4_ = (int)lVar4;
        auVar28._0_8_ = lVar4;
        auVar28._12_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar15 = (auVar28 | _DAT_001df1f0) ^ auVar1;
        auVar39._0_4_ = -(uint)(auVar15._0_4_ < -0x7fffff81);
        auVar39._4_4_ = -(uint)(auVar15._0_4_ < -0x7fffff81);
        auVar39._8_4_ = -(uint)(auVar15._8_4_ < -0x7fffff81);
        auVar39._12_4_ = -(uint)(auVar15._8_4_ < -0x7fffff81);
        auVar16._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
        auVar16._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
        auVar16._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
        auVar16._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
        auVar16 = auVar16 & auVar39;
        auVar56._0_4_ = uVar55 - 0x3a;
        auVar56._4_4_ = uVar60 - 0x3a;
        auVar56._8_4_ = uVar61 - 0x3a;
        auVar56._12_4_ = uVar62 - 0x3a;
        auVar29._0_4_ = uVar68 - 0x3a;
        auVar29._4_4_ = uVar71 - 0x3a;
        auVar29._8_4_ = uVar72 - 0x3a;
        auVar29._12_4_ = uVar73 - 0x3a;
        auVar40._0_4_ = uVar63 - 0x3a;
        auVar40._4_4_ = uVar65 - 0x3a;
        auVar40._8_4_ = uVar66 - 0x3a;
        auVar40._12_4_ = uVar67 - 0x3a;
        auVar43._0_4_ = uVar42 - 0x3a;
        auVar43._4_4_ = uVar52 - 0x3a;
        auVar43._8_4_ = uVar53 - 0x3a;
        auVar43._12_4_ = uVar54 - 0x3a;
        auVar43 = auVar43 ^ auVar1;
        auVar69._0_4_ = -(uint)(auVar43._0_4_ < 0x7ffffff6);
        auVar69._4_4_ = -(uint)(auVar43._4_4_ < 0x7ffffff6);
        auVar69._8_4_ = -(uint)(auVar43._8_4_ < 0x7ffffff6);
        auVar69._12_4_ = -(uint)(auVar43._12_4_ < 0x7ffffff6);
        auVar40 = auVar40 ^ auVar1;
        auVar44._0_4_ = -(uint)(auVar40._0_4_ < 0x7ffffff6);
        auVar44._4_4_ = -(uint)(auVar40._4_4_ < 0x7ffffff6);
        auVar44._8_4_ = -(uint)(auVar40._8_4_ < 0x7ffffff6);
        auVar44._12_4_ = -(uint)(auVar40._12_4_ < 0x7ffffff6);
        auVar29 = auVar29 ^ auVar1;
        auVar41._0_4_ = -(uint)(auVar29._0_4_ < 0x7ffffff6);
        auVar41._4_4_ = -(uint)(auVar29._4_4_ < 0x7ffffff6);
        auVar41._8_4_ = -(uint)(auVar29._8_4_ < 0x7ffffff6);
        auVar41._12_4_ = -(uint)(auVar29._12_4_ < 0x7ffffff6);
        auVar56 = auVar56 ^ auVar1;
        auVar30._0_4_ = -(uint)(auVar56._0_4_ < 0x7ffffff6);
        auVar30._4_4_ = -(uint)(auVar56._4_4_ < 0x7ffffff6);
        auVar30._8_4_ = -(uint)(auVar56._8_4_ < 0x7ffffff6);
        auVar30._12_4_ = -(uint)(auVar56._12_4_ < 0x7ffffff6);
        auVar57._0_4_ = (uVar14 & 0x5f) - 0x5b;
        auVar57._4_4_ = (uVar24 & 0x5f) - 0x5b;
        auVar57._8_4_ = (uVar26 & 0x5f) - 0x5b;
        auVar57._12_4_ = (uVar27 & 0x5f) - 0x5b;
        auVar57 = auVar57 ^ auVar1;
        auVar64._0_4_ = -(uint)(auVar57._0_4_ < 0x7fffffe6);
        auVar64._4_4_ = -(uint)(auVar57._4_4_ < 0x7fffffe6);
        auVar64._8_4_ = -(uint)(auVar57._8_4_ < 0x7fffffe6);
        auVar64._12_4_ = -(uint)(auVar57._12_4_ < 0x7fffffe6);
        auVar58._0_4_ = (uVar74 & 0x5f) - 0x5b;
        auVar58._4_4_ = (uVar75 & 0x5f) - 0x5b;
        auVar58._8_4_ = (uVar76 & 0x5f) - 0x5b;
        auVar58._12_4_ = (uVar77 & 0x5f) - 0x5b;
        auVar58 = auVar58 ^ auVar1;
        auVar70._0_4_ = -(uint)(auVar58._0_4_ < 0x7fffffe6);
        auVar70._4_4_ = -(uint)(auVar58._4_4_ < 0x7fffffe6);
        auVar70._8_4_ = -(uint)(auVar58._8_4_ < 0x7fffffe6);
        auVar70._12_4_ = -(uint)(auVar58._12_4_ < 0x7fffffe6);
        auVar45._0_4_ = (uVar6 & 0x5f) - 0x5b;
        auVar45._4_4_ = (uVar7 & 0x5f) - 0x5b;
        auVar45._8_4_ = (uVar8 & 0x5f) - 0x5b;
        auVar45._12_4_ = (uVar9 & 0x5f) - 0x5b;
        auVar29 = packssdw(auVar70 & auVar44,auVar64 & auVar69);
        auVar45 = auVar45 ^ auVar1;
        auVar59._0_4_ = -(uint)(auVar45._0_4_ < 0x7fffffe6);
        auVar59._4_4_ = -(uint)(auVar45._4_4_ < 0x7fffffe6);
        auVar59._8_4_ = -(uint)(auVar45._8_4_ < 0x7fffffe6);
        auVar59._12_4_ = -(uint)(auVar45._12_4_ < 0x7fffffe6);
        auVar15._0_4_ = (uVar10 & 0x5f) - 0x5b;
        auVar15._4_4_ = (uVar11 & 0x5f) - 0x5b;
        auVar15._8_4_ = (uVar12 & 0x5f) - 0x5b;
        auVar15._12_4_ = (uVar13 & 0x5f) - 0x5b;
        auVar15 = auVar15 ^ auVar1;
        auVar31._0_4_ = -(uint)(auVar15._0_4_ < 0x7fffffe6);
        auVar31._4_4_ = -(uint)(auVar15._4_4_ < 0x7fffffe6);
        auVar31._8_4_ = -(uint)(auVar15._8_4_ < 0x7fffffe6);
        auVar31._12_4_ = -(uint)(auVar15._12_4_ < 0x7fffffe6);
        auVar15 = packssdw(auVar31 & auVar30,auVar59 & auVar41);
        auVar15 = packsswb(auVar15,auVar29);
        auVar31 = pshuflw(auVar30,auVar16,0xe8);
        auVar31 = packssdw(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(char *)((long)&__s[1].pModule + lVar4 + 1) = auVar15[0];
        }
        auVar31 = packssdw(auVar16,auVar16);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._0_4_ >> 8 & 1) != 0) {
          *(char *)((long)&__s[1].pModule + lVar4 + 2) = auVar15[1];
        }
        auVar31 = (auVar28 | _DAT_001df1e0) ^ auVar1;
        iVar2 = auVar31._0_4_;
        iVar25 = auVar31._8_4_;
        auVar32._4_4_ = iVar2;
        auVar32._0_4_ = iVar2;
        auVar32._8_4_ = iVar25;
        auVar32._12_4_ = iVar25;
        auVar46._0_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar46._4_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar46._8_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar46._12_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar17._0_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar17._4_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar17._8_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar17._12_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar17 = auVar17 & auVar46;
        auVar31 = packssdw(auVar32,auVar17);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
          *(char *)((long)&__s[1].pModule + lVar4 + 3) = auVar15[2];
        }
        auVar31 = pshufhw(auVar17,auVar17,0x84);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._0_4_ >> 0x18 & 1) != 0) {
          *(char *)((long)&__s[1].pModule + lVar4 + 4) = auVar15[3];
        }
        auVar31 = (auVar28 | _DAT_001df1d0) ^ auVar1;
        iVar2 = auVar31._0_4_;
        iVar25 = auVar31._8_4_;
        auVar33._4_4_ = iVar2;
        auVar33._0_4_ = iVar2;
        auVar33._8_4_ = iVar25;
        auVar33._12_4_ = iVar25;
        auVar47._0_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar47._4_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar47._8_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar47._12_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar18._0_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar18._4_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar18._8_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar18._12_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar18 = auVar18 & auVar47;
        auVar31 = pshuflw(auVar33,auVar18,0xe8);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(char *)((long)&__s[1].pModule + lVar4 + 5) = auVar15[4];
        }
        auVar31 = packssdw(auVar18,auVar18);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._4_2_ >> 8 & 1) != 0) {
          *(char *)((long)&__s[1].pModule + lVar4 + 6) = auVar15[5];
        }
        auVar31 = (auVar28 | _DAT_001df1c0) ^ auVar1;
        iVar2 = auVar31._0_4_;
        iVar25 = auVar31._8_4_;
        auVar34._4_4_ = iVar2;
        auVar34._0_4_ = iVar2;
        auVar34._8_4_ = iVar25;
        auVar34._12_4_ = iVar25;
        auVar48._0_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar48._4_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar48._8_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar48._12_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar19._0_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar19._4_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar19._8_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar19._12_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar19 = auVar19 & auVar48;
        auVar31 = packssdw(auVar34,auVar19);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(char *)((long)&__s[1].pModule + lVar4 + 7) = auVar15[6];
        }
        auVar31 = pshufhw(auVar19,auVar19,0x84);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._6_2_ >> 8 & 1) != 0) {
          *(char *)((long)&__s[2].pModule + lVar4) = auVar15[7];
        }
        auVar31 = (auVar28 | _DAT_001df380) ^ auVar1;
        iVar2 = auVar31._0_4_;
        iVar25 = auVar31._8_4_;
        auVar35._4_4_ = iVar2;
        auVar35._0_4_ = iVar2;
        auVar35._8_4_ = iVar25;
        auVar35._12_4_ = iVar25;
        auVar49._0_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar49._4_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar49._8_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar49._12_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar20._0_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar20._4_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar20._8_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar20._12_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar20 = auVar20 & auVar49;
        auVar31 = pshuflw(auVar35,auVar20,0xe8);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(char *)((long)&__s[2].pModule + lVar4 + 1) = auVar15[8];
        }
        auVar31 = packssdw(auVar20,auVar20);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._8_2_ >> 8 & 1) != 0) {
          *(char *)((long)&__s[2].pModule + lVar4 + 2) = auVar15[9];
        }
        auVar31 = (auVar28 | _DAT_001df370) ^ auVar1;
        iVar2 = auVar31._0_4_;
        iVar25 = auVar31._8_4_;
        auVar36._4_4_ = iVar2;
        auVar36._0_4_ = iVar2;
        auVar36._8_4_ = iVar25;
        auVar36._12_4_ = iVar25;
        auVar50._0_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar50._4_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar50._8_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar50._12_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar21._0_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar21._4_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar21._8_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar21._12_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar21 = auVar21 & auVar50;
        auVar31 = packssdw(auVar36,auVar21);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(char *)((long)&__s[2].pModule + lVar4 + 3) = auVar15[10];
        }
        auVar31 = pshufhw(auVar21,auVar21,0x84);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._10_2_ >> 8 & 1) != 0) {
          *(char *)((long)&__s[2].pModule + lVar4 + 4) = auVar15[0xb];
        }
        auVar31 = (auVar28 | _DAT_001df360) ^ auVar1;
        iVar2 = auVar31._0_4_;
        iVar25 = auVar31._8_4_;
        auVar37._4_4_ = iVar2;
        auVar37._0_4_ = iVar2;
        auVar37._8_4_ = iVar25;
        auVar37._12_4_ = iVar25;
        auVar51._0_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar51._4_4_ = -(uint)(iVar2 < -0x7fffff81);
        auVar51._8_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar51._12_4_ = -(uint)(iVar25 < -0x7fffff81);
        auVar22._0_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar22._4_4_ = -(uint)(auVar31._4_4_ == -0x80000000);
        auVar22._8_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar22._12_4_ = -(uint)(auVar31._12_4_ == -0x80000000);
        auVar22 = auVar22 & auVar51;
        auVar31 = pshuflw(auVar37,auVar22,0xe8);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(char *)((long)&__s[2].pModule + lVar4 + 5) = auVar15[0xc];
        }
        auVar31 = packssdw(auVar22,auVar22);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._12_2_ >> 8 & 1) != 0) {
          *(char *)((long)&__s[2].pModule + lVar4 + 6) = auVar15[0xd];
        }
        auVar31 = (auVar28 | _DAT_001df350) ^ auVar1;
        iVar2 = auVar31._4_4_;
        iVar25 = auVar31._12_4_;
        auVar38._0_4_ = -(uint)(auVar31._0_4_ < -0x7fffff81);
        auVar38._4_4_ = -(uint)(auVar31._0_4_ < -0x7fffff81);
        auVar38._8_4_ = -(uint)(auVar31._8_4_ < -0x7fffff81);
        auVar38._12_4_ = -(uint)(auVar31._8_4_ < -0x7fffff81);
        auVar23._4_4_ = iVar2;
        auVar23._0_4_ = iVar2;
        auVar23._8_4_ = iVar25;
        auVar23._12_4_ = iVar25;
        auVar78._0_4_ = -(uint)(iVar2 == -0x80000000);
        auVar78._4_4_ = -(uint)(iVar2 == -0x80000000);
        auVar78._8_4_ = -(uint)(iVar25 == -0x80000000);
        auVar78._12_4_ = -(uint)(iVar25 == -0x80000000);
        auVar31 = packssdw(auVar23,auVar78 & auVar38);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(char *)((long)&__s[2].pModule + lVar4 + 7) = auVar15[0xe];
        }
        auVar31 = pshufhw(auVar31,auVar78 & auVar38,0x84);
        auVar31 = packssdw(auVar31,auVar31);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._14_2_ >> 8 & 1) != 0) {
          *(char *)((long)&__s[3].pModule + lVar4) = auVar15[0xf];
        }
        lVar4 = lVar4 + 0x10;
        uVar55 = uVar55 + 0x10;
        uVar60 = uVar60 + 0x10;
        uVar61 = uVar61 + 0x10;
        uVar62 = uVar62 + 0x10;
        uVar68 = uVar68 + 0x10;
        uVar71 = uVar71 + 0x10;
        uVar72 = uVar72 + 0x10;
        uVar73 = uVar73 + 0x10;
        uVar63 = uVar63 + 0x10;
        uVar65 = uVar65 + 0x10;
        uVar66 = uVar66 + 0x10;
        uVar67 = uVar67 + 0x10;
        uVar42 = uVar42 + 0x10;
        uVar52 = uVar52 + 0x10;
        uVar53 = uVar53 + 0x10;
        uVar54 = uVar54 + 0x10;
        uVar10 = uVar10 + 0x10;
        uVar11 = uVar11 + 0x10;
        uVar12 = uVar12 + 0x10;
        uVar13 = uVar13 + 0x10;
        uVar6 = uVar6 + 0x10;
        uVar7 = uVar7 + 0x10;
        uVar8 = uVar8 + 0x10;
        uVar9 = uVar9 + 0x10;
        uVar74 = uVar74 + 0x10;
        uVar75 = uVar75 + 0x10;
        uVar76 = uVar76 + 0x10;
        uVar77 = uVar77 + 0x10;
        uVar14 = uVar14 + 0x10;
        uVar24 = uVar24 + 0x10;
        uVar26 = uVar26 + 0x10;
        uVar27 = uVar27 + 0x10;
      } while (lVar4 != 0x80);
    }
    else {
      sVar3 = strlen(argv[1]);
      if (0 < (int)(uint)sVar3) {
        uVar5 = 0;
        do {
          if ((long)argv[1][uVar5] < 0) {
            sqlite3_free(__s);
            return 1;
          }
          *(undefined1 *)((long)&__s[1].pModule + (long)argv[1][uVar5]) = 1;
          uVar5 = uVar5 + 1;
        } while (((uint)sVar3 & 0x7fffffff) != uVar5);
      }
    }
    *ppTokenizer = __s;
    iVar25 = 0;
  }
  return iVar25;
}

Assistant:

static int simpleCreate(
  int argc, const char * const *argv,
  sqlite3_tokenizer **ppTokenizer
){
  simple_tokenizer *t;

  t = (simple_tokenizer *) sqlite3_malloc(sizeof(*t));
  if( t==NULL ) return SQLITE_NOMEM;
  memset(t, 0, sizeof(*t));

  /* TODO(shess) Delimiters need to remain the same from run to run,
  ** else we need to reindex.  One solution would be a meta-table to
  ** track such information in the database, then we'd only want this
  ** information on the initial create.
  */
  if( argc>1 ){
    int i, n = (int)strlen(argv[1]);
    for(i=0; i<n; i++){
      unsigned char ch = argv[1][i];
      /* We explicitly don't support UTF-8 delimiters for now. */
      if( ch>=0x80 ){
        sqlite3_free(t);
        return SQLITE_ERROR;
      }
      t->delim[ch] = 1;
    }
  } else {
    /* Mark non-alphanumeric ASCII characters as delimiters */
    int i;
    for(i=1; i<0x80; i++){
      t->delim[i] = !fts3_isalnum(i) ? -1 : 0;
    }
  }

  *ppTokenizer = &t->base;
  return SQLITE_OK;
}